

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::python::Generator::PrintMessageDescriptors
          (Generator *this,StripPrintDescriptor print_mode)

{
  int iVar1;
  Descriptor *pDVar2;
  int local_1c;
  int local_18;
  int i_1;
  int i;
  StripPrintDescriptor print_mode_local;
  Generator *this_local;
  
  if (print_mode == kCreate) {
    for (local_18 = 0; iVar1 = FileDescriptor::message_type_count(this->file_), local_18 < iVar1;
        local_18 = local_18 + 1) {
      pDVar2 = FileDescriptor::message_type(this->file_,local_18);
      PrintCreateDescriptor(this,pDVar2);
      io::Printer::Print<>(this->printer_,"\n");
    }
  }
  else {
    for (local_1c = 0; iVar1 = FileDescriptor::message_type_count(this->file_), local_1c < iVar1;
        local_1c = local_1c + 1) {
      pDVar2 = FileDescriptor::message_type(this->file_,local_1c);
      PrintFindDescriptor(this,pDVar2);
    }
  }
  return;
}

Assistant:

void Generator::PrintMessageDescriptors(StripPrintDescriptor print_mode) const {
  if (print_mode == StripPrintDescriptor::kCreate) {
    for (int i = 0; i < file_->message_type_count(); ++i) {
      PrintCreateDescriptor(*file_->message_type(i));
      printer_->Print("\n");
    }
  } else {
    for (int i = 0; i < file_->message_type_count(); ++i) {
      PrintFindDescriptor(*file_->message_type(i));
    }
  }
}